

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall unitStrings_eV_Test::TestBody(unitStrings_eV_Test *this)

{
  unit_data extraout_EAX;
  precise_unit *ppVar1;
  uint64_t in_RCX;
  uint64_t match_flags;
  char *pcVar2;
  double in_XMM1_Qa;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  precise_unit local_78;
  string local_68;
  double local_48;
  precise_unit local_40;
  undefined8 local_30;
  undefined8 local_28;
  
  local_40.multiplier_ = 299792458.0;
  local_40.base_units_ = (unit_data)0xf1;
  local_40.commodity_ = 0;
  local_78 = units::precise_unit::operator/((precise_unit *)units::precise::energy::eV,&local_40);
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_68,(units *)&local_78,ppVar1,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            (local_88,"to_string(precise::energy::eV / constants::c.as_unit())","\"eV/[c]\"",
             &local_68,(char (*) [7])"eV/[c]");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_30 = 0x41b1de784a000000;
  local_28 = 0xf1;
  local_48 = units::detail::power_const<double>(299792458.0,2);
  units::detail::unit_data::pow((unit_data *)&local_28,local_48,in_XMM1_Qa);
  match_flags = (ulong)local_28._4_4_ << 0x20;
  local_40.commodity_ = local_28._4_4_;
  local_40.base_units_ = extraout_EAX;
  local_40.multiplier_ = local_48;
  local_78 = units::precise_unit::operator/((precise_unit *)units::precise::energy::eV,&local_40);
  ppVar1 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_68,(units *)&local_78,ppVar1,match_flags);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            (local_88,"to_string(precise::energy::eV / (constants::c.as_unit().pow(2)))",
             "\"eV*[c]^-2\"",&local_68,(char (*) [10])"eV*[c]^-2");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1dd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  return;
}

Assistant:

TEST(unitStrings, eV)
{
    EXPECT_EQ(
        to_string(precise::energy::eV / constants::c.as_unit()), "eV/[c]");
    EXPECT_EQ(
        to_string(precise::energy::eV / (constants::c.as_unit().pow(2))),
        "eV*[c]^-2");
}